

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 SyMemBackendRelease(SyMemBackend *pBackend)

{
  sxu32 *psVar1;
  SyMemBlock *pSVar2;
  _func_void_void_ptr *p_Var3;
  sxi32 sVar4;
  SyMutexMethods *UNRECOVERED_JUMPTABLE;
  SyMemBlock *pSVar5;
  
  if ((pBackend->pMutexMethods != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    (*pBackend->pMutexMethods->xEnter)(pBackend->pMutex);
  }
  if (pBackend->nBlock != 0) {
    pSVar5 = pBackend->pBlocks;
    do {
      pSVar2 = pSVar5->pNext;
      (*pBackend->pMethods->xFree)(pSVar5);
      psVar1 = &pBackend->nBlock;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) break;
      pSVar5 = pSVar2->pNext;
      (*pBackend->pMethods->xFree)(pSVar2);
      psVar1 = &pBackend->nBlock;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) break;
      pSVar2 = pSVar5->pNext;
      (*pBackend->pMethods->xFree)(pSVar5);
      psVar1 = &pBackend->nBlock;
      *psVar1 = *psVar1 - 1;
      if (*psVar1 == 0) break;
      pSVar5 = pSVar2->pNext;
      (*pBackend->pMethods->xFree)(pSVar2);
      psVar1 = &pBackend->nBlock;
      *psVar1 = *psVar1 - 1;
    } while (*psVar1 != 0);
  }
  p_Var3 = pBackend->pMethods->xRelease;
  if (p_Var3 != (_func_void_void_ptr *)0x0) {
    (*p_Var3)(pBackend->pMethods->pUserData);
  }
  pBackend->pMethods = (SyMemMethods *)0x0;
  pBackend->pBlocks = (SyMemBlock *)0x0;
  UNRECOVERED_JUMPTABLE = pBackend->pMutexMethods;
  if ((UNRECOVERED_JUMPTABLE != (SyMutexMethods *)0x0) && (pBackend->pMutex != (SyMutex *)0x0)) {
    UNRECOVERED_JUMPTABLE = (SyMutexMethods *)(*UNRECOVERED_JUMPTABLE->xLeave)(pBackend->pMutex);
    if ((pBackend->pMutex != (SyMutex *)0x0) &&
       (UNRECOVERED_JUMPTABLE = (SyMutexMethods *)pBackend->pMutexMethods->xRelease,
       UNRECOVERED_JUMPTABLE != (SyMutexMethods *)0x0)) {
      sVar4 = (*(code *)UNRECOVERED_JUMPTABLE)();
      return sVar4;
    }
  }
  return (sxi32)UNRECOVERED_JUMPTABLE;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendRelease(SyMemBackend *pBackend)
{
	sxi32 rc;
#if defined(UNTRUST)
	if( SXMEM_BACKEND_CORRUPT(pBackend) ){
		return SXERR_INVALID;
	}
#endif
	if( pBackend->pMutexMethods ){
		SyMutexEnter(pBackend->pMutexMethods, pBackend->pMutex);
	}
	rc = MemBackendRelease(&(*pBackend));
	if( pBackend->pMutexMethods ){
		SyMutexLeave(pBackend->pMutexMethods, pBackend->pMutex);
		SyMutexRelease(pBackend->pMutexMethods, pBackend->pMutex);
	}
	return rc;
}